

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

Aig_Man_t *
Cgt_ManDupPartition(Aig_Man_t *pFrame,int nVarsMin,int nFlopsMin,int iStart,Aig_Man_t *pCare,
                   Vec_Vec_t *vSuppsInv,int *pnOutputs)

{
  bool bVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Vec_Ptr_t *vLeaves_00;
  Vec_Ptr_t *p_00;
  Aig_Man_t *p_01;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  int local_5c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vPos;
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *vRoots;
  Vec_Vec_t *vSuppsInv_local;
  Aig_Man_t *pCare_local;
  int iStart_local;
  int nFlopsMin_local;
  int nVarsMin_local;
  Aig_Man_t *pFrame_local;
  
  iVar2 = Aig_ManRegNum(pFrame);
  if (iVar2 != 0) {
    __assert_fail("Aig_ManRegNum(pFrame) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                  ,0x1bf,
                  "Aig_Man_t *Cgt_ManDupPartition(Aig_Man_t *, int, int, int, Aig_Man_t *, Vec_Vec_t *, int *)"
                 );
  }
  p = Vec_PtrAlloc(100);
  vLeaves_00 = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  p_01 = Aig_ManStart(nVarsMin);
  pcVar3 = Abc_UtilStrsav("partition");
  p_01->pName = pcVar3;
  Aig_ManIncrementTravId(pFrame);
  pAVar4 = Aig_ManConst1(p_01);
  pAVar5 = Aig_ManConst1(pFrame);
  (pAVar5->field_5).pData = pAVar4;
  pAVar4 = Aig_ManConst1(pFrame);
  Aig_ObjSetTravIdCurrent(pFrame,pAVar4);
  local_5c = iStart;
  while( true ) {
    bVar1 = false;
    if (local_5c < iStart + nFlopsMin) {
      iVar2 = Aig_ManCoNum(pFrame);
      bVar1 = local_5c < iVar2;
    }
    if (!bVar1) break;
    pAVar4 = Aig_ManCo(pFrame,local_5c);
    pAVar5 = Aig_ObjFanin0(pAVar4);
    Cgt_ManDupPartition_rec(p_01,pFrame,pAVar5,vLeaves_00);
    pAVar5 = Aig_ObjChild0Copy(pAVar4);
    Vec_PtrPush(p,pAVar5);
    Vec_PtrPush(p_00,pAVar4);
    local_5c = local_5c + 1;
  }
  while( true ) {
    iVar2 = Aig_ManObjNum(p_01);
    bVar1 = false;
    if (iVar2 < nVarsMin) {
      iVar2 = Aig_ManCoNum(pFrame);
      bVar1 = local_5c < iVar2;
    }
    if (!bVar1) break;
    pAVar4 = Aig_ManCo(pFrame,local_5c);
    pAVar5 = Aig_ObjFanin0(pAVar4);
    Cgt_ManDupPartition_rec(p_01,pFrame,pAVar5,vLeaves_00);
    pAVar5 = Aig_ObjChild0Copy(pAVar4);
    Vec_PtrPush(p,pAVar5);
    Vec_PtrPush(p_00,pAVar4);
    local_5c = local_5c + 1;
  }
  iVar2 = Vec_PtrSize(p);
  if ((nFlopsMin < iVar2) && (iVar2 = Vec_PtrSize(p), iVar2 < nFlopsMin)) {
    __assert_fail("nFlopsMin >= Vec_PtrSize(vRoots) || Vec_PtrSize(vRoots) >= nFlopsMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                  ,0x1d6,
                  "Aig_Man_t *Cgt_ManDupPartition(Aig_Man_t *, int, int, int, Aig_Man_t *, Vec_Vec_t *, int *)"
                 );
  }
  if (pCare != (Aig_Man_t *)0x0) {
    Cgt_ManConstructCare(p_01,pCare,vSuppsInv,vLeaves_00);
  }
  for (local_5c = 0; iVar2 = Vec_PtrSize(p_00), local_5c < iVar2; local_5c = local_5c + 1) {
    pvVar6 = Vec_PtrEntry(p_00,local_5c);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,local_5c);
    pAVar4 = Aig_ObjCreateCo(p_01,pAVar4);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  if (pnOutputs != (int *)0x0) {
    iVar2 = Vec_PtrSize(p_00);
    *pnOutputs = iVar2;
  }
  Vec_PtrFree(p);
  Vec_PtrFree(vLeaves_00);
  Vec_PtrFree(p_00);
  return p_01;
}

Assistant:

Aig_Man_t * Cgt_ManDupPartition( Aig_Man_t * pFrame, int nVarsMin, int nFlopsMin, int iStart, Aig_Man_t * pCare, Vec_Vec_t * vSuppsInv, int * pnOutputs )
{
    Vec_Ptr_t * vRoots, * vLeaves, * vPos;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(pFrame) == 0 );
    vRoots = Vec_PtrAlloc( 100 );
    vLeaves = Vec_PtrAlloc( 100 ); 
    vPos = Vec_PtrAlloc( 100 );
    pNew = Aig_ManStart( nVarsMin );
    pNew->pName = Abc_UtilStrsav( "partition" );
    Aig_ManIncrementTravId( pFrame );
    Aig_ManConst1(pFrame)->pData = Aig_ManConst1(pNew);
    Aig_ObjSetTravIdCurrent( pFrame, Aig_ManConst1(pFrame) );
    for ( i = iStart; i < iStart + nFlopsMin && i < Aig_ManCoNum(pFrame); i++ )
    {
        pObj = Aig_ManCo( pFrame, i );
        Cgt_ManDupPartition_rec( pNew, pFrame, Aig_ObjFanin0(pObj), vLeaves );
        Vec_PtrPush( vRoots, Aig_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPos, pObj );
    }
    for ( ; Aig_ManObjNum(pNew) < nVarsMin && i < Aig_ManCoNum(pFrame); i++ )
    {
        pObj = Aig_ManCo( pFrame, i );
        Cgt_ManDupPartition_rec( pNew, pFrame, Aig_ObjFanin0(pObj), vLeaves );
        Vec_PtrPush( vRoots, Aig_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPos, pObj );
    }
    assert( nFlopsMin >= Vec_PtrSize(vRoots) || Vec_PtrSize(vRoots) >= nFlopsMin );
    // create constaints
    if ( pCare )
        Cgt_ManConstructCare( pNew, pCare, vSuppsInv, vLeaves );
    // create POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vPos, pObj, i )
        pObj->pData = (Aig_Obj_t *)Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vRoots, i) );
    if ( pnOutputs != NULL )
        *pnOutputs = Vec_PtrSize( vPos );
    Vec_PtrFree( vRoots );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vPos );
    return pNew;
}